

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void recff_cdata_arith(jit_State *J,RecordFFData *rd)

{
  CTState *cts;
  CType *pCVar1;
  CTState *cts_00;
  TValue *pTVar2;
  uint64_t uVar3;
  ushort uVar4;
  IRRef1 IVar5;
  IRType IVar6;
  CTInfo CVar7;
  TRef TVar8;
  CTypeID CVar9;
  TRef TVar10;
  TRef TVar11;
  CTSize CVar12;
  GCcdata *pGVar13;
  ulong uVar14;
  CType *pCVar15;
  cTValue *tv;
  TRef *pTVar16;
  ushort uVar17;
  ushort uVar18;
  IROpT IVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  GCobj *o;
  int32_t iVar24;
  IRRef1 IVar25;
  TRef tr;
  uint uVar26;
  long lVar27;
  TRef sp [2];
  CType *s [2];
  CTSize ofs;
  
  cts = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  for (lVar27 = 0; pCVar15 = s[0], lVar27 != 2; lVar27 = lVar27 + 1) {
    uVar26 = J->base[lVar27];
    if (uVar26 == 0) goto LAB_001566df;
    uVar20 = uVar26 & 0x1f000000;
    if (uVar20 == 0) {
      uVar26 = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
LAB_00155cad:
      pCVar15 = cts->tab + 0x11;
    }
    else {
      IVar25 = (IRRef1)uVar26;
      if (uVar20 == 0xa000000) {
        pGVar13 = argv2cdata(J,uVar26,rd->argv + lVar27);
        uVar18 = pGVar13->ctypeid;
        pCVar1 = cts->tab;
        uVar26 = pCVar1[uVar18].info;
        pCVar15 = pCVar1 + uVar18;
        IVar6 = crec_ct2irt(cts,pCVar15);
        uVar26 = uVar26 >> 0x1c;
        uVar17 = (ushort)IVar6;
        if (uVar26 == 2) {
          (J->fold).ins.field_0.ot = uVar17 | 0x4500;
          (J->fold).ins.field_0.op1 = IVar25;
          (J->fold).ins.field_0.op2 = 0x15;
          uVar26 = lj_opt_fold(J);
          uVar23 = (ulong)pCVar15->info;
          if ((pCVar15->info & 0xf0800000) == 0x20800000) {
            uVar14 = uVar23 & 0xffff;
            uVar23 = (ulong)cts->tab[uVar14].info;
            pCVar15 = cts->tab + uVar14;
            IVar6 = crec_ct2irt(cts,pCVar15);
          }
LAB_00155c58:
          CVar7 = (CTInfo)uVar23;
          if ((CVar7 & 0xf0000000) == 0x50000000) {
            pCVar15 = cts->tab + (uVar23 & 0xffff);
            CVar7 = cts->tab[uVar23 & 0xffff].info;
          }
          if (CVar7 < 0x10000000) {
            if (IVar6 != IRT_CDATA) {
              (J->fold).ins.field_0.ot = (ushort)IVar6 | 0x4600;
              (J->fold).ins.field_0.op1 = (IRRef1)uVar26;
              (J->fold).ins.field_0.op2 = 0;
              goto LAB_00155eb8;
            }
            uVar26 = 0;
          }
        }
        else if (IVar6 - IRT_I64 < 2) {
          (J->fold).ins.field_0.ot = uVar17 | 0x4500;
          (J->fold).ins.field_0.op1 = IVar25;
          (J->fold).ins.field_0.op2 = 0x17;
LAB_00155eb8:
          uVar26 = lj_opt_fold(J);
        }
        else if (IVar6 - IRT_INT < 2) {
          (J->fold).ins.field_0.ot = uVar17 | 0x4500;
          (J->fold).ins.field_0.op1 = IVar25;
          (J->fold).ins.field_0.op2 = 0x16;
          uVar26 = lj_opt_fold(J);
          if ((pCVar15->info & 0xf0000000) == 0x50000000) {
            pCVar15 = cts->tab + (pCVar15->info & 0xffff);
          }
        }
        else {
          if (uVar26 != 6) {
            TVar8 = lj_ir_kint64(J,0x10);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar25;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
            uVar26 = lj_opt_fold(J);
            uVar23 = (ulong)pCVar15->info;
            goto LAB_00155c58;
          }
          if (lVar27 == 0) {
            uVar23 = 0;
          }
          else {
            uVar23 = ((long)s[0] - (long)pCVar1) / 0x18 & 0xffffffff;
          }
          (J->fold).ins.field_0.op1 = IVar25;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090015;
          uVar26 = lj_opt_fold(J);
          CVar9 = lj_ctype_intern(cts,uVar18 | 0x20030000,8);
          pCVar15 = cts->tab + CVar9;
          if (lVar27 != 0) {
            s[0] = cts->tab + uVar23;
          }
        }
      }
      else {
        pCVar15 = cts->tab;
        if ((uVar26 >> 0x18 & 0x1f) - 0xf < 5) {
          pCVar15 = pCVar15 + 9;
        }
        else if (uVar20 == 0xe000000) {
          pCVar15 = pCVar15 + 0xe;
        }
        else if (uVar20 == 0x4000000) {
          iVar22 = 1 - (int)lVar27;
          pGVar13 = argv2cdata(J,*(TRef *)((long)J->base + (ulong)(uint)(iVar22 * 4)),
                               (cTValue *)((ulong)(uint)(iVar22 * 8) + (long)rd->argv));
          pCVar1 = cts->tab;
          pCVar15 = pCVar1 + pGVar13->ctypeid;
          uVar20 = pCVar1[pGVar13->ctypeid].info >> 0x1c;
          if (uVar20 == 2) {
            TVar8 = lj_ir_kint64(J,0x18);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar25;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
            uVar26 = lj_opt_fold(J);
          }
          else if (uVar20 == 5) {
            o = (GCobj *)(rd->argv[lVar27].u64 & 0x7fffffffffff);
            pCVar15 = lj_ctype_getfieldq(cts,pCVar15,&o->str,&ofs,(CTInfo *)0x0);
            if ((pCVar15 == (CType *)0x0) || ((pCVar15->info & 0xf0000000) != 0xb0000000))
            goto LAB_00155cad;
            TVar8 = lj_ir_kgc(J,o,IRT_STR);
            (J->fold).ins.field_0.ot = 0x884;
            (J->fold).ins.field_0.op1 = IVar25;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
            lj_opt_fold(J);
            pCVar15 = cts->tab + (ushort)pCVar15->info;
            uVar26 = lj_ir_kint(J,ofs);
          }
          else {
            pCVar15 = pCVar1 + 0x11;
          }
        }
        else {
          pCVar15 = pCVar15 + 0x11;
          uVar26 = 0;
        }
      }
    }
    s[lVar27] = pCVar15;
    sp[lVar27] = uVar26;
  }
  uVar26 = rd->data;
  if (((uVar26 == 5) || (uVar26 == 8)) || (uVar23 = (ulong)sp[0], uVar23 == 0)) {
LAB_001564e9:
    pTVar16 = J->base;
    if (*pTVar16 != 0) {
      if ((rd->argv->field_4).it >> 0xf == 0x1fff5) {
        pGVar13 = argv2cdata(J,*pTVar16,rd->argv);
        uVar26 = cts->tab[pGVar13->ctypeid].info;
        uVar20 = (uint)pGVar13->ctypeid;
        if ((uVar26 & 0xf0000000) == 0x20000000) {
          uVar20 = uVar26 & 0xffff;
        }
        tv = lj_ctype_meta(cts,uVar20,rd->data);
        if (tv == (cTValue *)0x0) {
          pTVar16 = J->base;
          goto LAB_0015656d;
        }
LAB_001565e0:
        if ((tv->u64 & 0xffff800000000000) == 0xfffb800000000000) {
          crec_tailcall(J,rd,tv);
          return;
        }
        goto LAB_001566df;
      }
LAB_0015656d:
      if ((pTVar16[1] != 0) && ((rd->argv[1].u64 & 0xffff800000000000) == 0xfffa800000000000)) {
        pGVar13 = argv2cdata(J,pTVar16[1],rd->argv + 1);
        uVar26 = cts->tab[pGVar13->ctypeid].info;
        uVar20 = (uint)pGVar13->ctypeid;
        if ((uVar26 & 0xf0000000) == 0x20000000) {
          uVar20 = uVar26 & 0xffff;
        }
        tv = lj_ctype_meta(cts,uVar20,rd->data);
        if (tv != (cTValue *)0x0) goto LAB_001565e0;
      }
    }
    if (rd->data != 4) {
LAB_001566df:
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    uVar23 = (ulong)sp[0];
    TVar10 = 0x1007ffe;
    if (((sp[0] == 0) || (uVar14 = (ulong)sp[1], sp[1] == 0)) ||
       (uVar18 = 0x889, 0xfffffff < s[1]->info == s[0]->info < 0x10000000)) goto LAB_00156679;
  }
  else {
    uVar14 = (ulong)sp[1];
    if (((uVar14 != 0) && (uVar20 = s[0]->info, uVar20 < 0x10000000)) &&
       (uVar21 = s[1]->info, uVar21 < 0x10000000)) {
      uVar18 = 0x16;
      iVar24 = 0xc;
      if ((((uVar20 >> 0x17 & 1) == 0) || (s[0]->size != 8)) &&
         (((uVar21 >> 0x17 & 1) == 0 || (s[1]->size != 8)))) {
        iVar24 = 0xb;
        uVar18 = 0x15;
        if (((((9 < uVar26) || (((uVar21 | uVar20) >> 0x1a & 1) != 0)) || (s[0]->size != 4)) ||
            (s[1]->size != 4)) ||
           (((((uVar21 ^ uVar20) >> 0x17 & 1) != 0 &&
             (((short)sp[1] < 0 || ((J->cur).ir[sp[1] & 0x7fff].i < 0)))) &&
            (((short)sp[0] < 0 || (uVar20 = uVar21, (J->cur).ir[sp[0] & 0x7fff].i < 0))))))
        goto LAB_001560db;
        uVar18 = ((uVar20 >> 0x17 & 1) != 0) + 0x13;
      }
      else {
LAB_001560db:
        for (lVar27 = 0; TVar8 = sp[0], lVar27 != 2; lVar27 = lVar27 + 1) {
          uVar20 = sp[lVar27];
          uVar21 = uVar20 >> 0x18 & 0x1f;
          if (uVar21 - 0xd < 2) {
            uVar17 = (short)uVar21 + uVar18 * 0x20 + 0x1000;
LAB_0015613c:
            (J->fold).ins.field_0.ot = uVar18 + 0x5b00;
            (J->fold).ins.field_0.op1 = (IRRef1)uVar20;
            (J->fold).ins.field_0.op2 = uVar17;
            TVar8 = lj_opt_fold(J);
            sp[lVar27] = TVar8;
          }
          else if (1 < uVar21 - 0x15) {
            uVar17 = ((ushort)(s[lVar27]->info >> 0xc) & 0x800 | uVar18 * 0x20) ^ 0x813;
            goto LAB_0015613c;
          }
        }
        if (9 < uVar26) {
          uVar23 = (ulong)sp[0];
          uVar14 = (ulong)sp[1];
          (J->fold).ins.field_0.ot = (short)(uVar26 << 8) + uVar18 + 0x1f00;
          (J->fold).ins.field_0.op1 = (IRRef1)sp[0];
          (J->fold).ins.field_0.op2 = (IRRef1)sp[1];
          TVar10 = lj_opt_fold(J);
          TVar11 = lj_ir_kint(J,iVar24);
          (J->fold).ins.field_0.ot = 0x548a;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
          TVar10 = lj_opt_fold(J);
          if (TVar10 != 0) goto LAB_00156679;
          if (TVar8 == 0) goto LAB_001564e9;
          goto LAB_00156225;
        }
      }
      uVar17 = 0x800;
      if (uVar26 != 4) {
        uVar4 = (ushort)(uVar26 != 6) * 0x200;
        uVar17 = uVar4 + 0x400;
        if ((uVar18 & 0xfffd) != 0x14) {
          uVar17 = uVar4;
        }
      }
      uVar18 = uVar17 | uVar18 | 0x80;
      uVar23 = (ulong)sp[0];
      uVar14 = (ulong)sp[1];
      goto LAB_00156654;
    }
LAB_00156225:
    TVar8 = (TRef)uVar14;
    if (TVar8 == 0) goto LAB_001564e9;
    cts_00 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
    uVar20 = pCVar15->info;
    TVar10 = (TRef)uVar23;
    if ((uVar20 & 0xf0000000) != 0x20000000 && (uVar20 & 0xfc000000) != 0x30000000) {
      if ((0xfffffff < uVar20 || uVar26 != 10) ||
         (uVar20 = s[1]->info, pCVar15 = s[1], TVar11 = TVar8,
         (uVar20 & 0xf0000000) != 0x20000000 && (uVar20 & 0xfc000000) != 0x30000000))
      goto LAB_001564e9;
LAB_001563b4:
      sp[1] = TVar10;
      sp[0] = TVar11;
      uVar21 = (uint)(uVar23 >> 0x18) & 0x1f;
      CVar12 = lj_ctype_size(cts_00,uVar20 & 0xffff);
      if (uVar21 - 0xd < 2) {
        uVar18 = (ushort)uVar21 | 0x12a0;
LAB_0015641e:
        (J->fold).ins.field_0.ot = 0x5b15;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar23;
        (J->fold).ins.field_0.op2 = uVar18;
        TVar10 = lj_opt_fold(J);
        uVar23 = (ulong)TVar10;
      }
      else if (1 < uVar21 - 0x15) {
        uVar18 = (ushort)(uVar23 >> 0xd) & 0x800 | 0x2b3;
        goto LAB_0015641e;
      }
      TVar10 = lj_ir_kint64(J,(ulong)CVar12);
      (J->fold).ins.field_0.ot = 0x2b15;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar23;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
      TVar10 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = (short)(uVar26 << 8) + 0x1f09;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
      TVar8 = lj_opt_fold(J);
      IVar25 = (IRRef1)TVar8;
      CVar9 = lj_ctype_intern(cts_00,(ushort)pCVar15->info | 0x20030000,8);
      TVar8 = lj_ir_kint(J,CVar9);
      IVar5 = (IRRef1)TVar8;
      IVar19 = 0x548a;
LAB_001564c4:
      (J->fold).ins.field_0.ot = IVar19;
      (J->fold).ins.field_0.op1 = IVar5;
      (J->fold).ins.field_0.op2 = IVar25;
      TVar10 = lj_opt_fold(J);
      if (TVar10 != 0) goto LAB_00156679;
      goto LAB_001564e9;
    }
    if ((0xb < uVar26) ||
       (((0x8d0U >> (uVar26 & 0x1f) & 1) == 0 ||
        ((s[1]->info & 0xf0000000) != 0x20000000 && (s[1]->info & 0xfc000000) != 0x30000000)))) {
      if (((uVar26 & 0xfffffffe) == 10) &&
         (uVar23 = uVar14, TVar8 = TVar10, TVar11 = sp[0], TVar10 = sp[1], s[1]->info < 0x10000000))
      goto LAB_001563b4;
      goto LAB_001564e9;
    }
    if (uVar26 == 4) {
      uVar18 = 0x889;
    }
    else {
      if (uVar26 == 0xb) {
        CVar12 = lj_ctype_size(cts_00,uVar20 & 0xffff);
        if ((CVar12 ^ CVar12 - 1) <= CVar12 - 1) goto LAB_001564e9;
        (J->fold).ins.field_0.ot = 0x2a15;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar23;
        (J->fold).ins.field_0.op2 = (IRRef1)uVar14;
        TVar8 = lj_opt_fold(J);
        iVar24 = 0x1f;
        if (CVar12 != 0) {
          for (; CVar12 >> iVar24 == 0; iVar24 = iVar24 + -1) {
          }
        }
        TVar10 = lj_ir_kint(J,iVar24);
        (J->fold).ins.field_0.ot = 0x2615;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
        TVar8 = lj_opt_fold(J);
        IVar5 = (IRRef1)TVar8;
        IVar25 = 0x1d5;
        IVar19 = 0x5b0e;
        goto LAB_001564c4;
      }
      uVar18 = (ushort)(uVar26 != 6) << 9 | 0x489;
    }
  }
LAB_00156654:
  (J->fold).ins.field_0.ot = uVar18;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar23;
  (J->fold).ins.field_0.op2 = (IRRef1)uVar14;
  J->postproc = LJ_POST_FIXGUARD;
  TVar10 = 0x2007ffd;
LAB_00156679:
  *J->base = TVar10;
  if (((J->postproc == LJ_POST_FIXGUARD) && (pTVar2 = J->L->base, (pTVar2[-1].u32.lo & 7) == 2)) &&
     ((-1 < (char)(J->guardemit).irt &&
      (uVar3 = pTVar2[-3].u64, (*(uint *)(uVar3 - 4) & 0xfc) < 0xc)))) {
    *(uint64_t *)&J[-1].penalty[0x31].val = uVar3 - 4;
    J->postproc = LJ_POST_FIXCOMP;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_arith(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef sp[2];
  CType *s[2];
  MSize i;
  for (i = 0; i < 2; i++) {
    TRef tr = J->base[i];
    CType *ct = ctype_get(cts, CTID_DOUBLE);
    if (!tr) {
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    } else if (tref_iscdata(tr)) {
      CTypeID id = argv2cdata(J, tr, &rd->argv[i])->ctypeid;
      IRType t;
      ct = ctype_raw(cts, id);
      t = crec_ct2irt(cts, ct);
      if (ctype_isptr(ct->info)) {  /* Resolve pointer or reference. */
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_PTR);
	if (ctype_isref(ct->info)) {
	  ct = ctype_rawchild(cts, ct);
	  t = crec_ct2irt(cts, ct);
	}
      } else if (t == IRT_I64 || t == IRT_U64) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT64);
	lj_needsplit(J);
	goto ok;
      } else if (t == IRT_INT || t == IRT_U32) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT);
	if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
	goto ok;
      } else if (ctype_isfunc(ct->info)) {
	CTypeID id0 = i ? ctype_typeid(cts, s[0]) : 0;
	tr = emitir(IRT(IR_FLOAD, IRT_PTR), tr, IRFL_CDATA_PTR);
	ct = ctype_get(cts,
	  lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR));
	if (i) {
	  s[0] = ctype_get(cts, id0);  /* cts->tab may have been reallocated. */
	}
	goto ok;
      } else {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCcdata)));
      }
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info)) {
	if (t == IRT_CDATA) {
	  tr = 0;
	} else {
	  if (t == IRT_I64 || t == IRT_U64) lj_needsplit(J);
	  tr = emitir(IRT(IR_XLOAD, t), tr, 0);
	}
      }
    } else if (tref_isnil(tr)) {
      tr = lj_ir_kptr(J, NULL);
      ct = ctype_get(cts, CTID_P_VOID);
    } else if (tref_isinteger(tr)) {
      ct = ctype_get(cts, CTID_INT32);
    } else if (tref_isstr(tr)) {
      TRef tr2 = J->base[1-i];
      CTypeID id = argv2cdata(J, tr2, &rd->argv[1-i])->ctypeid;
      ct = ctype_raw(cts, id);
      if (ctype_isenum(ct->info)) {  /* Match string against enum constant. */
	GCstr *str = strV(&rd->argv[i]);
	CTSize ofs;
	CType *cct = lj_ctype_getfield(cts, ct, str, &ofs);
	if (cct && ctype_isconstval(cct->info)) {
	  /* Specialize to the name of the enum constant. */
	  emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, str));
	  ct = ctype_child(cts, cct);
	  tr = lj_ir_kint(J, (int32_t)ofs);
	} else {  /* Interpreter will throw or return false. */
	  ct = ctype_get(cts, CTID_P_VOID);
	}
      } else if (ctype_isptr(ct->info)) {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCstr)));
      } else {
	ct = ctype_get(cts, CTID_P_VOID);
      }
    } else if (!tref_isnum(tr)) {
      tr = 0;
      ct = ctype_get(cts, CTID_P_VOID);
    }
  ok:
    s[i] = ct;
    sp[i] = tr;
  }
  {
    TRef tr;
    MMS mm = (MMS)rd->data;
    if ((mm == MM_len || mm == MM_concat ||
	 (!(tr = crec_arith_int64(J, sp, s, mm)) &&
	  !(tr = crec_arith_ptr(J, sp, s, mm)))) &&
	!(tr = crec_arith_meta(J, sp, s, cts, rd)))
      return;
    J->base[0] = tr;
    /* Fixup cdata comparisons, too. Avoids some cdata escapes. */
    if (J->postproc == LJ_POST_FIXGUARD && frame_iscont(J->L->base-1) &&
	!irt_isguard(J->guardemit)) {
      const BCIns *pc = frame_contpc(J->L->base-1) - 1;
      if (bc_op(*pc) <= BC_ISNEP) {
	J2G(J)->tmptv.u64 = (uint64_t)(uintptr_t)pc;
	J->postproc = LJ_POST_FIXCOMP;
      }
    }
  }
}